

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

int __thiscall glslang::TScanContext::identifierOrType(TScanContext *this)

{
  char *__s;
  char cVar1;
  int iVar2;
  TPoolAllocator *this_00;
  TString *this_01;
  TSymbol *pTVar3;
  undefined4 extraout_var;
  long *plVar4;
  int iVar5;
  pool_allocator<char> local_28;
  
  __s = this->tokenText;
  this_00 = GetThreadPoolAllocator();
  this_01 = (TString *)TPoolAllocator::allocate(this_00,0x28);
  local_28.allocator = GetThreadPoolAllocator();
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)this_01,__s,
             &local_28);
  (this->parserToken->sType->lex).field_1.string = this_01;
  iVar5 = 0x289;
  if (this->field == false) {
    pTVar3 = TSymbolTable::find(this->parseContext->symbolTable,
                                (this->parserToken->sType->lex).field_1.string,(bool *)0x0,
                                (bool *)0x0,(int *)0x0);
    (this->parserToken->sType->lex).symbol = pTVar3;
    if ((this->afterStruct == false && this->afterType == false) &&
       (pTVar3 = (this->parserToken->sType->lex).symbol, pTVar3 != (TSymbol *)0x0)) {
      iVar2 = (*pTVar3->_vptr_TSymbol[9])();
      plVar4 = (long *)CONCAT44(extraout_var,iVar2);
      if (plVar4 != (long *)0x0) {
        cVar1 = (**(code **)(*plVar4 + 0xb0))(plVar4);
        if (cVar1 != '\0') {
          plVar4 = (long *)(**(code **)(*plVar4 + 0x60))(plVar4);
          iVar2 = (**(code **)(*plVar4 + 0x38))(plVar4);
          if ((iVar2 != 0x12) || (this->afterBuffer == false)) {
            this->afterType = true;
            iVar5 = 0x28a;
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int TScanContext::identifierOrType()
{
    parserToken->sType.lex.string = NewPoolTString(tokenText);
    if (field)
        return IDENTIFIER;

    parserToken->sType.lex.symbol = parseContext.symbolTable.find(*parserToken->sType.lex.string);
    if ((afterType == false && afterStruct == false) && parserToken->sType.lex.symbol != nullptr) {
        if (const TVariable* variable = parserToken->sType.lex.symbol->getAsVariable()) {
            if (variable->isUserType() &&
                // treat redeclaration of forward-declared buffer/uniform reference as an identifier
                !(variable->getType().isReference() && afterBuffer)) {
                afterType = true;

                return TYPE_NAME;
            }
        }
    }

    return IDENTIFIER;
}